

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picosha2.h
# Opt level: O2

void __thiscall picosha2::hash256_one_by_one::add_to_data_length(hash256_one_by_one *this,word_t n)

{
  size_t i;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  this->data_length_digits_[0] = this->data_length_digits_[0] + n;
  uVar3 = 0;
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 4) {
      return;
    }
    uVar2 = uVar3 + this->data_length_digits_[lVar1];
    this->data_length_digits_[lVar1] = uVar2;
    if (uVar2 < 0x10000) break;
    uVar3 = uVar2 >> 0x10;
    this->data_length_digits_[lVar1] = uVar2 & 0xffff;
    lVar1 = lVar1 + 1;
  }
  return;
}

Assistant:

void add_to_data_length(word_t n) {
        word_t carry = 0;
        data_length_digits_[0] += n;
        for (std::size_t i = 0; i < 4; ++i) {
            data_length_digits_[i] += carry;
            if (data_length_digits_[i] >= 65536u) {
                carry = data_length_digits_[i] >> 16;
                data_length_digits_[i] &= 65535u;
            } else {
                break;
            }
        }
    }